

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

void __thiscall QDirPrivate::setPath(QDirPrivate *this,QString *path)

{
  bool bVar1;
  qsizetype qVar2;
  __off_t __length;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QString p;
  QFileSystemEntry *in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  CaseSensitivity cs;
  QFileSystemEntry *this_00;
  QDirPrivate *in_stack_ffffffffffffff38;
  QChar c;
  QChar local_92;
  QString local_90 [3];
  QFileSystemEntry local_40;
  long local_8;
  
  c.ucs = (char16_t)((ulong)in_RDI >> 0x30);
  cs = (CaseSensitivity)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_90[0].d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_90[0].d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  local_90[0].d.size = -0x5555555555555556;
  QDir::fromNativeSeparators(&in_stack_ffffffffffffff28->m_filePath);
  QChar::QChar<char16_t,_true>(&local_92,L'/');
  bVar1 = QString::endsWith((QString *)in_stack_ffffffffffffff38,c,cs);
  if ((bVar1) && (qVar2 = QString::size(local_90), 1 < qVar2)) {
    qVar2 = QString::size(local_90);
    QString::truncate(local_90,(char *)(qVar2 + -1),__length);
  }
  this_00 = &local_40;
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)in_stack_ffffffffffffff38,&this_00->m_filePath,
             SUB81((ulong)local_90 >> 0x38,0));
  QFileSystemEntry::operator=(this_00,in_stack_ffffffffffffff28);
  QFileSystemEntry::~QFileSystemEntry(this_00);
  clearCache(in_stack_ffffffffffffff38,(MetaDataClearing)((ulong)this_00 >> 0x20));
  QFileSystemEntry::QFileSystemEntry(this_00);
  QFileSystemEntry::operator=(this_00,in_stack_ffffffffffffff28);
  QFileSystemEntry::~QFileSystemEntry(this_00);
  QString::~QString((QString *)0x177e08);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

inline void QDirPrivate::setPath(const QString &path)
{
    QString p = QDir::fromNativeSeparators(path);
    if (p.endsWith(u'/')
            && p.size() > 1
#if defined(Q_OS_WIN)
        && (!(p.length() == 3 && p.at(1).unicode() == ':' && p.at(0).isLetter()))
#endif
    ) {
            p.truncate(p.size() - 1);
    }
    dirEntry = QFileSystemEntry(p, QFileSystemEntry::FromInternalPath());
    clearCache(IncludingMetaData);
    fileCache.absoluteDirEntry = QFileSystemEntry();
}